

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O2

bool IDictionary::isOperator1(string *str)

{
  iterator iVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_15a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_159;
  allocator local_158;
  allocator local_157;
  allocator local_156;
  allocator local_155;
  allocator local_154;
  allocator local_153;
  allocator local_152;
  allocator local_151;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  operator1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string((string *)&local_120,"+",&local_151);
  std::__cxx11::string::string(local_100,"-",&local_152);
  std::__cxx11::string::string(local_e0,"~",&local_153);
  std::__cxx11::string::string(local_c0,"&",&local_154);
  std::__cxx11::string::string(local_a0,"!",&local_155);
  std::__cxx11::string::string(local_80,"++",&local_156);
  std::__cxx11::string::string(local_60,"--",&local_157);
  std::__cxx11::string::string(local_40,"*",&local_158);
  __l._M_len = 8;
  __l._M_array = &local_120;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&operator1,__l,&local_159,&local_15a);
  lVar2 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&operator1._M_t,str);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&operator1._M_t);
  return (_Rb_tree_header *)iVar1._M_node != &operator1._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool IDictionary::isOperator1(std::string str) {
    std::set<std::string> operator1({"+","-","~","&","!","++","--","*"});
    return operator1.find(str)!=operator1.end();
}